

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-writer.c
# Opt level: O3

void test_bson_writer_custom_realloc(void)

{
  char cVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  int *extraout_RDX;
  int iVar5;
  undefined8 unaff_RBP;
  undefined7 uVar6;
  ulong uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int x;
  bson_t *b;
  uint8_t *buf;
  size_t buflen;
  undefined8 uStack_140;
  char *pcStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 *puStack_120;
  code *pcStack_118;
  char *pcStack_108;
  undefined1 auStack_100 [8];
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined1 *puStack_e8;
  code *pcStack_e0;
  char *pcStack_d0;
  undefined8 uStack_c8;
  undefined1 auStack_c0 [8];
  undefined8 uStack_b8;
  ulong uStack_b0;
  code *pcStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 auStack_80 [40];
  undefined8 uStack_58;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = bson_malloc(0);
  local_10 = 0;
  uVar3 = bson_writer_new(&local_18,&local_10,0,test_bson_writer_custom_realloc_helper);
  cVar1 = bson_writer_begin(uVar3,&local_20);
  if (cVar1 == '\0') {
    test_bson_writer_custom_realloc_cold_1();
LAB_00137dfd:
    test_bson_writer_custom_realloc_cold_2();
  }
  else {
    cVar1 = bson_append_utf8(local_20,"hello",0xffffffff,"world",0xffffffff);
    if (cVar1 == '\0') goto LAB_00137dfd;
    bson_writer_end(uVar3);
    bson_writer_destroy(uVar3);
  }
  test_bson_writer_custom_realloc_cold_3();
  pcStack_a8 = (code *)0x137e1f;
  uStack_58 = uVar3;
  uStack_90 = bson_malloc0(0x20);
  uStack_88 = 0x20;
  uVar4 = 0;
  pcStack_a8 = (code *)0x137e47;
  uVar3 = bson_writer_new(&uStack_90,&uStack_88,0,bson_realloc_ctx,0);
  uVar6 = (undefined7)((ulong)unaff_RBP >> 8);
  bVar8 = true;
  do {
    pcStack_a8 = (code *)0x137e62;
    cVar1 = bson_writer_begin(uVar3,&uStack_98);
    if (cVar1 == '\0') {
LAB_00137f28:
      pcStack_a8 = (code *)0x137f2d;
      test_bson_writer_shared_buffer_cold_1();
      goto LAB_00137f2d;
    }
    uVar7 = 0;
    do {
      pcStack_a8 = (code *)0x137e80;
      bson_uint32_to_string(uVar7 & 0xffffffff,&uStack_a0,auStack_80,0x20);
      pcStack_a8 = (code *)0x137e96;
      cVar1 = bson_append_int64(uStack_98,uStack_a0,0xffffffff,uVar7);
      if (cVar1 == '\0') {
        pcStack_a8 = (code *)0x137f28;
        test_bson_writer_shared_buffer_cold_2();
        goto LAB_00137f28;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 1000);
    pcStack_a8 = (code *)0x137eb2;
    uVar7 = bson_writer_get_length(uVar3);
    if (0x3000000 < uVar7) {
      pcStack_a8 = (code *)0x137ee8;
      bson_writer_rollback(uVar3);
      goto LAB_00137ee8;
    }
    pcStack_a8 = (code *)0x137ec2;
    bson_writer_end();
    bVar8 = (uint)uVar4 < 9999;
    uVar2 = (uint)uVar4 + 1;
    uVar4 = (ulong)uVar2;
  } while (uVar2 != 10000);
  bVar8 = false;
  uVar6 = 0;
LAB_00137ee8:
  pcStack_a8 = (code *)0x137ef0;
  uVar4 = bson_writer_get_length(uVar3);
  pcStack_a8 = (code *)0x137efb;
  bson_writer_destroy(uVar3);
  if (uVar4 < 0x3000000) {
    if (bVar8 != false) {
      pcStack_a8 = (code *)0x137f14;
      bson_free(uStack_90);
      return;
    }
  }
  else {
LAB_00137f2d:
    pcStack_a8 = (code *)0x137f32;
    test_bson_writer_shared_buffer_cold_3();
  }
  pcStack_a8 = test_bson_writer_empty_sequence;
  test_bson_writer_shared_buffer_cold_4();
  pcStack_d0 = (char *)0x0;
  uStack_c8 = 0;
  pcStack_e0 = (code *)0x137f62;
  uStack_b8 = uVar3;
  uStack_b0 = uVar4;
  pcStack_a8._0_1_ = bVar8;
  pcStack_a8._1_7_ = uVar6;
  uVar3 = bson_writer_new(&pcStack_d0,&uStack_c8,0,bson_realloc_ctx,0);
  uVar4 = 5;
  do {
    pcStack_e0 = (code *)0x137f7a;
    cVar1 = bson_writer_begin(uVar3,auStack_c0);
    if (cVar1 == '\0') {
      pcStack_e0 = (code *)0x137fd7;
      test_bson_writer_empty_sequence_cold_1();
      goto LAB_00137fd7;
    }
    pcStack_e0 = (code *)0x137f86;
    bson_writer_end(uVar3);
    uVar2 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar2;
  } while (uVar2 != 0);
  auVar12[0] = -(pcStack_d0[9] == '\0');
  auVar12[1] = -(pcStack_d0[10] == '\x05');
  auVar12[2] = -(pcStack_d0[0xb] == '\0');
  auVar12[3] = -(pcStack_d0[0xc] == '\0');
  auVar12[4] = -(pcStack_d0[0xd] == '\0');
  auVar12[5] = -(pcStack_d0[0xe] == '\0');
  auVar12[6] = -(pcStack_d0[0xf] == '\x05');
  auVar12[7] = -(pcStack_d0[0x10] == '\0');
  auVar12[8] = -(pcStack_d0[0x11] == '\0');
  auVar12[9] = -(pcStack_d0[0x12] == '\0');
  auVar12[10] = -(pcStack_d0[0x13] == '\0');
  auVar12[0xb] = -(pcStack_d0[0x14] == '\x05');
  auVar12[0xc] = -(pcStack_d0[0x15] == '\0');
  auVar12[0xd] = -(pcStack_d0[0x16] == '\0');
  auVar12[0xe] = -(pcStack_d0[0x17] == '\0');
  auVar12[0xf] = -(pcStack_d0[0x18] == '\0');
  auVar9[0] = -(*pcStack_d0 == '\x05');
  auVar9[1] = -(pcStack_d0[1] == '\0');
  auVar9[2] = -(pcStack_d0[2] == '\0');
  auVar9[3] = -(pcStack_d0[3] == '\0');
  auVar9[4] = -(pcStack_d0[4] == '\0');
  auVar9[5] = -(pcStack_d0[5] == '\x05');
  auVar9[6] = -(pcStack_d0[6] == '\0');
  auVar9[7] = -(pcStack_d0[7] == '\0');
  auVar9[8] = -(pcStack_d0[8] == '\0');
  auVar9[9] = -(pcStack_d0[9] == '\0');
  auVar9[10] = -(pcStack_d0[10] == '\x05');
  auVar9[0xb] = -(pcStack_d0[0xb] == '\0');
  auVar9[0xc] = -(pcStack_d0[0xc] == '\0');
  auVar9[0xd] = -(pcStack_d0[0xd] == '\0');
  auVar9[0xe] = -(pcStack_d0[0xe] == '\0');
  auVar9[0xf] = -(pcStack_d0[0xf] == '\x05');
  auVar9 = auVar9 & auVar12;
  if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
    pcStack_e0 = (code *)0x137fbf;
    bson_writer_destroy(uVar3);
    pcStack_e0 = (code *)0x137fc9;
    bson_free(pcStack_d0);
    return;
  }
LAB_00137fd7:
  pcStack_e0 = test_bson_writer_null_realloc;
  test_bson_writer_empty_sequence_cold_2();
  pcStack_118 = (code *)0x137fee;
  uStack_f0 = uVar3;
  puStack_e8 = auStack_c0;
  pcStack_e0 = (code *)uVar4;
  pcStack_108 = (char *)bson_malloc0(0x20);
  uStack_f8 = 0x20;
  pcStack_118 = (code *)0x13800e;
  uVar3 = bson_writer_new(&pcStack_108,&uStack_f8,0,0,0);
  uVar4 = 6;
  do {
    pcStack_118 = (code *)0x138026;
    cVar1 = bson_writer_begin(uVar3,auStack_100);
    if (cVar1 == '\0') {
      pcStack_118 = (code *)0x138094;
      test_bson_writer_null_realloc_cold_1();
      goto LAB_00138094;
    }
    pcStack_118 = (code *)0x138032;
    bson_writer_end(uVar3);
    uVar2 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar2;
  } while (uVar2 != 0);
  pcStack_118 = (code *)0x138043;
  cVar1 = bson_writer_begin(uVar3,auStack_100);
  if (cVar1 == '\0') {
    auVar13[0] = -(pcStack_108[0x10] == '\0');
    auVar13[1] = -(pcStack_108[0x11] == '\0');
    auVar13[2] = -(pcStack_108[0x12] == '\0');
    auVar13[3] = -(pcStack_108[0x13] == '\0');
    auVar13[4] = -(pcStack_108[0x14] == '\x05');
    auVar13[5] = -(pcStack_108[0x15] == '\0');
    auVar13[6] = -(pcStack_108[0x16] == '\0');
    auVar13[7] = -(pcStack_108[0x17] == '\0');
    auVar13[8] = -(pcStack_108[0x18] == '\0');
    auVar13[9] = -(pcStack_108[0x19] == '\x05');
    auVar13[10] = -(pcStack_108[0x1a] == '\0');
    auVar13[0xb] = -(pcStack_108[0x1b] == '\0');
    auVar13[0xc] = -(pcStack_108[0x1c] == '\0');
    auVar13[0xd] = -(pcStack_108[0x1d] == '\0');
    auVar13[0xe] = -(pcStack_108[0x1e] == '\0');
    auVar13[0xf] = -(pcStack_108[0x1f] == '\0');
    auVar10[0] = -(*pcStack_108 == '\x05');
    auVar10[1] = -(pcStack_108[1] == '\0');
    auVar10[2] = -(pcStack_108[2] == '\0');
    auVar10[3] = -(pcStack_108[3] == '\0');
    auVar10[4] = -(pcStack_108[4] == '\0');
    auVar10[5] = -(pcStack_108[5] == '\x05');
    auVar10[6] = -(pcStack_108[6] == '\0');
    auVar10[7] = -(pcStack_108[7] == '\0');
    auVar10[8] = -(pcStack_108[8] == '\0');
    auVar10[9] = -(pcStack_108[9] == '\0');
    auVar10[10] = -(pcStack_108[10] == '\x05');
    auVar10[0xb] = -(pcStack_108[0xb] == '\0');
    auVar10[0xc] = -(pcStack_108[0xc] == '\0');
    auVar10[0xd] = -(pcStack_108[0xd] == '\0');
    auVar10[0xe] = -(pcStack_108[0xe] == '\0');
    auVar10[0xf] = -(pcStack_108[0xf] == '\x05');
    auVar10 = auVar10 & auVar13;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
      pcStack_118 = (code *)0x13807c;
      bson_writer_destroy(uVar3);
      pcStack_118 = (code *)0x138086;
      bson_free(pcStack_108);
      return;
    }
  }
  else {
LAB_00138094:
    pcStack_118 = (code *)0x138099;
    test_bson_writer_null_realloc_cold_3();
  }
  pcStack_118 = test_bson_writer_null_realloc_2;
  test_bson_writer_null_realloc_cold_2();
  uStack_128 = uVar3;
  puStack_120 = auStack_100;
  pcStack_118 = (code *)uVar4;
  pcStack_138 = (char *)bson_malloc0(0x20);
  uStack_130 = 0x20;
  uVar3 = bson_writer_new(&pcStack_138,&uStack_130,0,0,0);
  iVar5 = 5;
  do {
    cVar1 = bson_writer_begin(uVar3,&uStack_140);
    if (cVar1 == '\0') {
      test_bson_writer_null_realloc_2_cold_1();
      goto LAB_00138181;
    }
    bson_writer_end(uVar3);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  cVar1 = bson_writer_begin(uVar3,&uStack_140);
  if (cVar1 == '\0') {
LAB_00138181:
    test_bson_writer_null_realloc_2_cold_2();
  }
  else {
    cVar1 = bson_append_int32(uStack_140,"a",0xffffffff,0x7b);
    if (cVar1 == '\0') {
      bson_writer_end(uVar3);
      auVar14[0] = -(pcStack_138[0x10] == '\0');
      auVar14[1] = -(pcStack_138[0x11] == '\0');
      auVar14[2] = -(pcStack_138[0x12] == '\0');
      auVar14[3] = -(pcStack_138[0x13] == '\0');
      auVar14[4] = -(pcStack_138[0x14] == '\x05');
      auVar14[5] = -(pcStack_138[0x15] == '\0');
      auVar14[6] = -(pcStack_138[0x16] == '\0');
      auVar14[7] = -(pcStack_138[0x17] == '\0');
      auVar14[8] = -(pcStack_138[0x18] == '\0');
      auVar14[9] = -(pcStack_138[0x19] == '\x05');
      auVar14[10] = -(pcStack_138[0x1a] == '\0');
      auVar14[0xb] = -(pcStack_138[0x1b] == '\0');
      auVar14[0xc] = -(pcStack_138[0x1c] == '\0');
      auVar14[0xd] = -(pcStack_138[0x1d] == '\0');
      auVar14[0xe] = -(pcStack_138[0x1e] == '\0');
      auVar14[0xf] = -(pcStack_138[0x1f] == '\0');
      auVar11[0] = -(*pcStack_138 == '\x05');
      auVar11[1] = -(pcStack_138[1] == '\0');
      auVar11[2] = -(pcStack_138[2] == '\0');
      auVar11[3] = -(pcStack_138[3] == '\0');
      auVar11[4] = -(pcStack_138[4] == '\0');
      auVar11[5] = -(pcStack_138[5] == '\x05');
      auVar11[6] = -(pcStack_138[6] == '\0');
      auVar11[7] = -(pcStack_138[7] == '\0');
      auVar11[8] = -(pcStack_138[8] == '\0');
      auVar11[9] = -(pcStack_138[9] == '\0');
      auVar11[10] = -(pcStack_138[10] == '\x05');
      auVar11[0xb] = -(pcStack_138[0xb] == '\0');
      auVar11[0xc] = -(pcStack_138[0xc] == '\0');
      auVar11[0xd] = -(pcStack_138[0xd] == '\0');
      auVar11[0xe] = -(pcStack_138[0xe] == '\0');
      auVar11[0xf] = -(pcStack_138[0xf] == '\x05');
      auVar11 = auVar11 & auVar14;
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) {
        bson_writer_destroy(uVar3);
        bson_free(pcStack_138);
        return;
      }
      goto LAB_0013818b;
    }
  }
  test_bson_writer_null_realloc_2_cold_4();
LAB_0013818b:
  test_bson_writer_null_realloc_2_cold_3();
  *extraout_RDX = *extraout_RDX + 1;
  bson_realloc();
  return;
}

Assistant:

static void
test_bson_writer_custom_realloc (void)
{
   bson_writer_t *writer;
   uint8_t *buf = bson_malloc (0);
   size_t buflen = 0;
   bson_t *b;
   int x = 0;

   writer = bson_writer_new (
      &buf, &buflen, 0, test_bson_writer_custom_realloc_helper, &x);

   BSON_ASSERT (bson_writer_begin (writer, &b));

   BSON_ASSERT (bson_append_utf8 (b, "hello", -1, "world", -1));

   bson_writer_end (writer);

   bson_writer_destroy (writer);

   BSON_ASSERT_CMPINT (x, >, 0);

   bson_free (buf);
}